

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaJf.c
# Opt level: O2

void Jf_ObjComputeBestCut(Jf_Man_t *p,Gia_Obj_t *pObj,int fEdge,int fEla)

{
  uint *__src;
  int *piVar1;
  uint uVar2;
  Vec_Int_t *p_00;
  int i;
  int iVar3;
  int iVar4;
  int iVar5;
  uint *puVar6;
  int i_00;
  uint *pCut;
  uint *puVar7;
  int iVar8;
  uint *pCut_00;
  ulong __n;
  float fVar9;
  float local_5c;
  int local_54;
  
  i = Gia_ObjId(p->pGia,pObj);
  puVar6 = (uint *)Jf_ObjCuts(p,i);
  __src = puVar6 + 1;
  local_5c = 1e+09;
  iVar5 = 1000000000;
  local_54 = 1000000000;
  iVar8 = 0;
  pCut = (uint *)0x0;
  pCut_00 = __src;
  do {
    if ((int)*puVar6 <= iVar8) {
      iVar5 = Jf_CutArr(p,(int *)pCut);
      Vec_IntWriteEntry(&p->vArr,i,iVar5);
      if (fEla == 0) {
        fVar9 = Vec_FltEntry(&p->vRefs,i);
        Vec_FltWriteEntry(&p->vFlow,i,local_5c / fVar9);
      }
      if (pCut <= puVar6) {
        __assert_fail("pCuts < pCut",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaJf.c"
                      ,0x1ff,"void Jf_ObjSetBestCut(int *, int *, Vec_Int_t *)");
      }
      if (pCut <= __src) {
        return;
      }
      p_00 = p->vTemp;
      uVar2 = *pCut;
      Vec_IntGrow(p_00,(int)((ulong)((long)pCut - (long)__src) >> 2));
      __n = ((long)pCut - (long)__src) * 0x40000000 >> 0x1e & 0xfffffffffffffffc;
      memmove(p_00->pArray,__src,__n);
      memmove(__src,pCut,(ulong)(uVar2 & 0xf) * 4 + 4);
      memmove(__src + (ulong)(uVar2 & 0xf) + 1,p_00->pArray,__n);
      return;
    }
    iVar3 = Jf_CutIsTriv((int *)pCut_00,i);
    if (iVar3 == 0) {
      if (fEla == 0 && fEdge != 0) {
        *pCut_00 = *pCut_00 & 0xffffff0f | (*pCut_00 & 0xf) << 4;
LAB_005ec749:
        fVar9 = Jf_CutFlow(p,(int *)pCut_00);
        fVar9 = (float)(*pCut_00 >> 4 & 0xf) + fVar9;
      }
      else {
        if (fEla == 0) goto LAB_005ec749;
        p->vTemp->nSize = 0;
        if (fEdge == 0) {
          iVar3 = Jf_CutAreaRef_rec(p,(int *)pCut_00);
        }
        else {
          iVar3 = Jf_CutAreaRefEdge_rec(p,(int *)pCut_00);
        }
        for (i_00 = 0; i_00 < p->vTemp->nSize; i_00 = i_00 + 1) {
          iVar4 = Vec_IntEntry(p->vTemp,i_00);
          piVar1 = p->pGia->pRefs + iVar4;
          *piVar1 = *piVar1 + -1;
        }
        fVar9 = (float)iVar3;
      }
      puVar7 = pCut_00;
      iVar3 = iVar5;
      if (((pCut != (uint *)0x0) && (local_5c <= fVar9 + 0.005)) &&
         ((local_5c <= fVar9 + -0.005 ||
          (iVar5 = Jf_CutArr(p,(int *)pCut_00), iVar3 = iVar5, local_54 <= iVar5))))
      goto LAB_005ec6f7;
    }
    else {
LAB_005ec6f7:
      puVar7 = pCut;
      fVar9 = local_5c;
      iVar3 = local_54;
    }
    local_54 = iVar3;
    iVar8 = iVar8 + 1;
    pCut_00 = pCut_00 + (ulong)(*pCut_00 & 0xf) + 1;
    pCut = puVar7;
    local_5c = fVar9;
  } while( true );
}

Assistant:

void Jf_ObjComputeBestCut( Jf_Man_t * p, Gia_Obj_t * pObj, int fEdge, int fEla )
{
    int i, iObj = Gia_ObjId( p->pGia, pObj );
    int * pCuts = Jf_ObjCuts( p, iObj );
    int * pCut, * pCutBest = NULL;
    int Time = ABC_INFINITY, TimeBest = ABC_INFINITY;
    float Area, AreaBest = ABC_INFINITY;
    Jf_ObjForEachCut( pCuts, pCut, i )
    {
        if ( Jf_CutIsTriv(pCut, iObj) ) continue;
        if ( fEdge && !fEla ) 
            Jf_CutSetCost(pCut, Jf_CutSize(pCut));
        Area = fEla ? Jf_CutArea(p, pCut, fEdge) : Jf_CutFlow(p, pCut) + Jf_CutCost(pCut);
        if ( pCutBest == NULL || AreaBest > Area + JF_EPSILON || (AreaBest > Area - JF_EPSILON && TimeBest > (Time = Jf_CutArr(p, pCut))) )
            pCutBest = pCut, AreaBest = Area, TimeBest = Time;
    }
    Vec_IntWriteEntry( &p->vArr,  iObj, Jf_CutArr(p, pCutBest) );
    if ( !fEla )
    Vec_FltWriteEntry( &p->vFlow, iObj, AreaBest / Jf_ObjRefs(p, iObj) );
    Jf_ObjSetBestCut( pCuts, pCutBest, p->vTemp );
//    Jf_CutPrint( Jf_ObjCutBest(p, iObj) ); printf( "\n" );
}